

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *out,QRegularExpression *re)

{
  QRegularExpressionPrivate *pQVar1;
  QDataStream *this;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (re->d).d.ptr;
  local_30.d.d = (pQVar1->pattern).d.d;
  local_30.d.ptr = (pQVar1->pattern).d.ptr;
  local_30.d.size = (pQVar1->pattern).d.size;
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this = operator<<(out,&local_30);
  QDataStream::operator<<
            (this,(((re->d).d.ptr)->patternOptions).
                  super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                  super_QFlagsStorage<QRegularExpression::PatternOption>.i);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return out;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QRegularExpression &re)
{
    out << re.pattern() << quint32(re.patternOptions().toInt());
    return out;
}